

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuMatrix.hpp
# Opt level: O2

Matrix<float,_1,_1> tcu::operator*(Matrix<float,_1,_2> *a,Matrix<float,_2,_1> *b)

{
  int ndx;
  long lVar1;
  Matrix<float,_1,_1> *res;
  Vector<tcu::Vector<float,_1>,_1> *in_RDI;
  float v;
  Matrix<float,_1,_1> MVar2;
  
  MVar2.m_data.m_data[0].m_data[0] = (Vector<tcu::Vector<float,_1>,_1>)(Vector<float,_1>  [1])0x0;
  for (lVar1 = 0; lVar1 != 2; lVar1 = lVar1 + 1) {
    MVar2.m_data.m_data[0].m_data[0] =
         (Vector<tcu::Vector<float,_1>,_1>)
         ((float)MVar2.m_data.m_data[0].m_data[0] +
         (a->m_data).m_data[lVar1].m_data[0] * (b->m_data).m_data[0].m_data[lVar1]);
  }
  in_RDI->m_data[0] = (Vector<float,_1>)MVar2.m_data.m_data[0].m_data[0];
  return (Matrix<float,_1,_1>)MVar2.m_data.m_data[0].m_data[0];
}

Assistant:

Matrix<T, Rows0, Cols1> operator* (const Matrix<T, Rows0, Cols0>& a, const Matrix<T, Rows1, Cols1>& b)
{
	DE_STATIC_ASSERT(Cols0 == Rows1);
	Matrix<T, Rows0, Cols1> res;
	for (int row = 0; row < Rows0; row++)
	{
		for (int col = 0; col < Cols1; col++)
		{
			T v = T(0);
			for (int ndx = 0; ndx < Cols0; ndx++)
				v += a(row,ndx) * b(ndx,col);
			res(row,col) = v;
		}
	}
	return res;
}